

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<absl::lts_20250127::Cord>::Add
          (RepeatedField<absl::lts_20250127::Cord> *this,Cord *value)

{
  int new_size;
  ulong uVar1;
  CordRep *pCVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  bool is_soo;
  bool is_soo_00;
  bool bVar6;
  int local_3c;
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  is_soo_00 = (uVar1 & 4) == 0;
  iVar3 = internal::SooRep::size(&this->soo_rep_,is_soo_00);
  local_3c = 0;
  if ((uVar1 & 4) == 0) {
    pcVar5 = (char *)((long)&(this->soo_rep_).field_0 + 8);
  }
  else {
    local_3c = (this->soo_rep_).field_0.long_rep.capacity;
    pcVar5 = internal::LongSooRep::elements((LongSooRep *)this);
  }
  new_size = iVar3 + 1;
  bVar6 = iVar3 == local_3c;
  if (bVar6) {
    Grow(this,(uVar1 & 4) == 0,iVar3,new_size);
    local_3c = (this->soo_rep_).field_0.long_rep.capacity;
    pcVar5 = internal::LongSooRep::elements((LongSooRep *)this);
  }
  bVar6 = !bVar6;
  is_soo = bVar6 && is_soo_00;
  iVar3 = internal::SooRep::size(&this->soo_rep_,is_soo);
  if ((iVar3 != new_size) &&
     ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    internal::LongSooRep::elements((LongSooRep *)this);
  }
  set_size(this,is_soo,new_size);
  pCVar2 = (value->contents_).data_.rep_.field_0.as_tree.rep;
  *(cordz_info_t *)(pcVar5 + (long)iVar3 * 0x10) =
       (value->contents_).data_.rep_.field_0.as_tree.cordz_info;
  *(CordRep **)((long)(pcVar5 + (long)iVar3 * 0x10) + 8) = pCVar2;
  (value->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
  (value->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  if (is_soo != ((undefined1  [16])
                 ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                (undefined1  [16])0x0)) {
    internal::protobuf_assumption_failed
              ("is_soo == final_is_soo",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x366);
  }
  iVar3 = internal::SooRep::size(&this->soo_rep_,is_soo);
  if (new_size != iVar3) {
    internal::protobuf_assumption_failed
              ("new_size == final_size",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x368);
  }
  if (bVar6 && is_soo_00) {
    pcVar4 = (char *)((long)&(this->soo_rep_).field_0 + 8);
  }
  else {
    pcVar4 = internal::LongSooRep::elements((LongSooRep *)this);
  }
  if (pcVar5 != pcVar4) {
    internal::protobuf_assumption_failed
              ("elem == final_elements",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x36a);
  }
  iVar3 = 0;
  if (!bVar6 || !is_soo_00) {
    iVar3 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (local_3c != iVar3) {
    internal::protobuf_assumption_failed
              ("capacity == final_capacity",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x36c);
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::Add(Element value) {
  bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  int capacity = Capacity(is_soo);
  Element* elem = unsafe_elements(is_soo);
  if (ABSL_PREDICT_FALSE(old_size == capacity)) {
    Grow(is_soo, old_size, old_size + 1);
    is_soo = false;
    capacity = Capacity(is_soo);
    elem = unsafe_elements(is_soo);
  }
  int new_size = old_size + 1;
  void* p = elem + ExchangeCurrentSize(is_soo, new_size);
  ::new (p) Element(std::move(value));

  // The below helps the compiler optimize dense loops.
  // Note: we can't call functions in PROTOBUF_ASSUME so use local variables.
  [[maybe_unused]] const bool final_is_soo = this->is_soo();
  PROTOBUF_ASSUME(is_soo == final_is_soo);
  [[maybe_unused]] const int final_size = size(is_soo);
  PROTOBUF_ASSUME(new_size == final_size);
  [[maybe_unused]] Element* const final_elements = unsafe_elements(is_soo);
  PROTOBUF_ASSUME(elem == final_elements);
  [[maybe_unused]] const int final_capacity = Capacity(is_soo);
  PROTOBUF_ASSUME(capacity == final_capacity);
}